

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

void __thiscall soul::PoolAllocator::Pool::~Pool(Pool *this)

{
  PoolItem *pPVar1;
  PoolItem *item;
  size_t i;
  Pool *this_local;
  
  for (item = (PoolItem *)0x0; item < (PoolItem *)this->nextSlot;
      item = (PoolItem *)((long)&item->size + pPVar1->size)) {
    pPVar1 = getItem(this,(size_t)item);
    if (pPVar1->destructor != (DestructorFn *)0x0) {
      (*pPVar1->destructor)(&pPVar1->item);
    }
  }
  return;
}

Assistant:

~Pool()
        {
            for (size_t i = 0; i < nextSlot;)
            {
                auto item = getItem (i);

                if (item->destructor != nullptr)
                    item->destructor (&item->item);

                i += item->size;
            }
        }